

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler.c
# Opt level: O3

void affect_check_area(AREA_DATA_conflict *area,int where,long *vector)

{
  AREA_AFFECT_DATA *pAVar1;
  bool bVar2;
  
  if (vector != (long *)0x0) {
    for (pAVar1 = area->affected; pAVar1 != (AREA_AFFECT_DATA *)0x0; pAVar1 = pAVar1->next) {
      if ((pAVar1->where == where) && (bVar2 = vector_equal(pAVar1->bitvector,vector), bVar2)) {
        if (where != 0) {
          return;
        }
        BITWISE_OR(area->affected_by,vector);
        return;
      }
    }
  }
  return;
}

Assistant:

void affect_check_area(AREA_DATA *area, int where, long vector[])
{
	AREA_AFFECT_DATA *paf;

	if (vector == 0)
		return;

	for (paf = area->affected; paf != nullptr; paf = paf->next)
	{
		if (paf->where == where && vector_equal(paf->bitvector, vector))
		{
			switch (where)
			{
				case TO_AREA_AFFECTS:
					BITWISE_OR(area->affected_by, vector);
					break;
			}

			return;
		}
	}
}